

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::DescriptorPoolFeaturesTest_InvalidRange_Test::
~DescriptorPoolFeaturesTest_InvalidRange_Test(DescriptorPoolFeaturesTest_InvalidRange_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest(&this->super_DescriptorPoolFeaturesTest);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(DescriptorPoolFeaturesTest, InvalidRange) {
  FeatureSetDefaults defaults = ParseTextOrDie(R"pb(
    minimum_edition: EDITION_2023
    maximum_edition: EDITION_PROTO2
  )pb");
  EXPECT_THAT(pool_.SetFeatureSetDefaults(std::move(defaults)),
              StatusIs(absl::StatusCode::kInvalidArgument,
                       AllOf(HasSubstr("Invalid edition range"),
                             HasSubstr("PROTO2"), HasSubstr("2023"))));
}